

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *pcVar1;
  int iVar2;
  uint8_t *__s1;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  unsigned_long bit;
  unsigned_long hat;
  int8_t maximum;
  int8_t minimum;
  _GLFWmapelement *e;
  anon_struct_16_2_6ab6935c fields [22];
  size_t length;
  size_t i;
  char *c;
  char *string_local;
  _GLFWmapping *mapping_local;
  
  fields[0].name = (char *)0x0;
  fields[0].element = (_GLFWmapelement *)0x14afea;
  fields[1].name = (char *)mapping->buttons;
  fields[1].element = (_GLFWmapelement *)0x12a90b;
  fields[2].name = (char *)(mapping->buttons + 1);
  fields[2].element = (_GLFWmapelement *)0x12ca7a;
  fields[3].name = (char *)(mapping->buttons + 2);
  fields[3].element = (_GLFWmapelement *)0x14a91f;
  fields[4].name = (char *)(mapping->buttons + 3);
  fields[4].element = (_GLFWmapelement *)0x12c2bd;
  fields[5].name = (char *)(mapping->buttons + 6);
  fields[5].element = (_GLFWmapelement *)anon_var_dwarf_12abc;
  fields[6].name = (char *)(mapping->buttons + 7);
  fields[6].element = (_GLFWmapelement *)anon_var_dwarf_12ad2;
  fields[7].name = (char *)(mapping->buttons + 8);
  fields[7].element = (_GLFWmapelement *)anon_var_dwarf_12adc;
  fields[8].name = (char *)(mapping->buttons + 4);
  fields[8].element = (_GLFWmapelement *)anon_var_dwarf_12af2;
  fields[9].name = (char *)(mapping->buttons + 5);
  fields[9].element = (_GLFWmapelement *)anon_var_dwarf_12afc;
  fields[10].name = (char *)(mapping->buttons + 9);
  fields[10].element = (_GLFWmapelement *)anon_var_dwarf_12b12;
  fields[0xb].name = (char *)(mapping->buttons + 10);
  fields[0xb].element = (_GLFWmapelement *)anon_var_dwarf_12b28;
  fields[0xc].name = (char *)(mapping->buttons + 0xb);
  fields[0xc].element = (_GLFWmapelement *)anon_var_dwarf_12b32;
  fields[0xd].name = (char *)(mapping->buttons + 0xc);
  fields[0xd].element = (_GLFWmapelement *)anon_var_dwarf_12b48;
  fields[0xe].name = (char *)(mapping->buttons + 0xd);
  fields[0xe].element = (_GLFWmapelement *)anon_var_dwarf_12b5e;
  fields[0xf].name = (char *)(mapping->buttons + 0xe);
  fields[0xf].element = (_GLFWmapelement *)anon_var_dwarf_12b68;
  fields[0x10].name = (char *)(mapping->axes + 4);
  fields[0x10].element = (_GLFWmapelement *)anon_var_dwarf_12b7e;
  fields[0x11].name = (char *)(mapping->axes + 5);
  fields[0x11].element = (_GLFWmapelement *)anon_var_dwarf_12b88;
  fields[0x12].name = (char *)mapping->axes;
  fields[0x12].element = (_GLFWmapelement *)anon_var_dwarf_12b92;
  fields[0x13].name = (char *)(mapping->axes + 1);
  fields[0x13].element = (_GLFWmapelement *)anon_var_dwarf_12b9c;
  fields[0x14].name = (char *)(mapping->axes + 2);
  fields[0x14].element = (_GLFWmapelement *)anon_var_dwarf_12ba6;
  fields[0x15].name = (char *)(mapping->axes + 3);
  i = (size_t)string;
  c = string;
  string_local = mapping->name;
  fields[0x15].element = (_GLFWmapelement *)strcspn(string,",");
  if ((fields[0x15].element == (_GLFWmapelement *)0x20) && (*(char *)(i + 0x20) == ',')) {
    memcpy(string_local + 0x80,(void *)i,0x20);
    i = (size_t)(&(fields[0x15].element)->index + i);
    fields[0x15].element = (_GLFWmapelement *)strcspn((char *)i,",");
    if ((fields[0x15].element < (_GLFWmapelement *)0x80) &&
       ((&(fields[0x15].element)->type)[i] == ',')) {
      memcpy(string_local,(void *)i,(size_t)fields[0x15].element);
      for (i = (size_t)(&(fields[0x15].element)->index + i); *(char *)i != '\0'; i = sVar5 + i) {
        if ((*(char *)i == '+') || (*(char *)i == '-')) {
          return 0;
        }
        for (length = 0; length < 0x16; length = length + 1) {
          fields[0x15].element = (_GLFWmapelement *)strlen((char *)fields[length - 1].element);
          iVar2 = strncmp((char *)i,(char *)fields[length - 1].element,(size_t)fields[0x15].element)
          ;
          if ((iVar2 == 0) && ((&(fields[0x15].element)->type)[i] == ':')) {
            __s1 = &(fields[0x15].element)->index + i;
            i = (size_t)__s1;
            if (fields[length].name == (char *)0x0) {
              fields[0x15].element = (_GLFWmapelement *)0x5;
              iVar2 = strncmp((char *)__s1,"Linux",5);
              if (iVar2 != 0) {
                return 0;
              }
              break;
            }
            pcVar1 = fields[length].name;
            hat._7_1_ = -1;
            hat._6_1_ = true;
            if (*__s1 == '+') {
              hat._7_1_ = '\0';
              i = (size_t)(__s1 + 1);
            }
            else {
              if (*__s1 == '-') {
                i = (size_t)(__s1 + 1);
              }
              hat._6_1_ = *__s1 != '-';
            }
            if (*(char *)i == 'a') {
              *pcVar1 = '\x01';
            }
            else if (*(char *)i == 'b') {
              *pcVar1 = '\x02';
            }
            else {
              if (*(char *)i != 'h') break;
              *pcVar1 = '\x03';
            }
            if (*pcVar1 == '\x03') {
              uVar3 = strtoul((char *)(i + 1),(char **)&i,10);
              uVar4 = strtoul((char *)(i + 1),(char **)&i,10);
              pcVar1[1] = (byte)(uVar3 << 4) | (byte)uVar4;
            }
            else {
              uVar3 = strtoul((char *)(i + 1),(char **)&i,10);
              pcVar1[1] = (char)uVar3;
            }
            if (*pcVar1 == '\x01') {
              pcVar1[2] = (char)(2 / (long)((int)hat._6_1_ - (int)hat._7_1_));
              pcVar1[3] = -(hat._6_1_ + hat._7_1_);
              if (*(char *)i == '~') {
                pcVar1[2] = -pcVar1[2];
                pcVar1[3] = -pcVar1[3];
              }
            }
            break;
          }
        }
        sVar5 = strcspn((char *)i,",");
        i = sVar5 + i;
        sVar5 = strspn((char *)i,",");
      }
      for (length = 0; length < 0x20; length = length + 1) {
        if (('@' < string_local[length + 0x80]) && (string_local[length + 0x80] < 'G')) {
          string_local[length + 0x80] = string_local[length + 0x80] + ' ';
        }
      }
      _glfwPlatformUpdateGamepadGUID(string_local + 0x80);
      mapping_local._4_4_ = 1;
    }
    else {
      _glfwInputError(0x10004,(char *)0x0);
      mapping_local._4_4_ = 0;
    }
  }
  else {
    _glfwInputError(0x10004,(char *)0x0);
    mapping_local._4_4_ = 0;
  }
  return mapping_local._4_4_;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}